

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  ImU32 col_00;
  ImGuiMouseCursor cursor_type;
  ImGuiCol local_b0;
  float local_ac;
  ImU32 col;
  float local_9c;
  float local_98;
  float size_2_maximum_delta;
  float size_1_maximum_delta;
  float mouse_delta;
  ImVec2 local_88;
  ImVec2 mouse_delta_2d;
  ImRect bb_render;
  undefined1 local_68 [8];
  ImRect bb_interact;
  bool held;
  bool hovered;
  bool item_add;
  ImGuiItemFlags item_flags_backup;
  ImGuiWindow *window;
  ImGuiContext *g;
  float hover_visibility_delay_local;
  float hover_extend_local;
  float min_size2_local;
  float min_size1_local;
  float *size2_local;
  float *size1_local;
  ImGuiAxis axis_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  bb_interact.Max.y = (float)(pIVar1->DC).ItemFlags;
  (pIVar1->DC).ItemFlags = (pIVar1->DC).ItemFlags | 0x18;
  bb_interact.Max.x._3_1_ = ItemAdd(bb,id,(ImRect *)0x0);
  (pIVar1->DC).ItemFlags = (ImGuiItemFlags)bb_interact.Max.y;
  if ((bool)bb_interact.Max.x._3_1_) {
    local_68 = *(undefined1 (*) [8])&bb->Min;
    bb_interact.Min = bb->Max;
    if (axis == ImGuiAxis_Y) {
      ImVec2::ImVec2(&bb_render.Max,0.0,hover_extend);
    }
    else {
      ImVec2::ImVec2(&bb_render.Max,hover_extend,0.0);
    }
    ImRect::Expand((ImRect *)local_68,&bb_render.Max);
    ButtonBehavior((ImRect *)local_68,id,(bool *)((long)&bb_interact.Max.x + 2),
                   (bool *)((long)&bb_interact.Max.x + 1),0x180);
    if (pIVar3->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if (((bb_interact.Max.x._1_1_ & 1) != 0) ||
       (((pIVar3->HoveredId == id && (pIVar3->HoveredIdPreviousFrame == id)) &&
        (hover_visibility_delay <= pIVar3->HoveredIdTimer)))) {
      cursor_type = 4;
      if (axis == ImGuiAxis_Y) {
        cursor_type = 3;
      }
      SetMouseCursor(cursor_type);
    }
    mouse_delta_2d = bb->Min;
    bb_render.Min = bb->Max;
    if ((bb_interact.Max.x._1_1_ & 1) != 0) {
      _size_1_maximum_delta = operator-(&(pIVar3->IO).MousePos,&pIVar3->ActiveIdClickOffset);
      local_88 = operator-((ImVec2 *)&size_1_maximum_delta,(ImVec2 *)local_68);
      if (axis == ImGuiAxis_Y) {
        local_ac = local_88.y;
      }
      else {
        local_ac = local_88.x;
      }
      size_2_maximum_delta = local_ac;
      local_98 = ImMax<float>(0.0,*size1 - min_size1);
      local_9c = ImMax<float>(0.0,*size2 - min_size2);
      if (size_2_maximum_delta < -local_98) {
        size_2_maximum_delta = -local_98;
      }
      if (local_9c < size_2_maximum_delta) {
        size_2_maximum_delta = local_9c;
      }
      if ((size_2_maximum_delta != 0.0) || (NAN(size_2_maximum_delta))) {
        if ((size_2_maximum_delta < 0.0) && (*size1 + size_2_maximum_delta < min_size1)) {
          __assert_fail("*size1 + mouse_delta >= min_size1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                        ,0x555,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        if ((0.0 < size_2_maximum_delta) && (*size2 - size_2_maximum_delta < min_size2)) {
          __assert_fail("*size2 - mouse_delta >= min_size2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                        ,0x557,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        *size1 = size_2_maximum_delta + *size1;
        *size2 = *size2 - size_2_maximum_delta;
        if (axis == ImGuiAxis_X) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff5c,size_2_maximum_delta,0.0);
        }
        else {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff5c,0.0,size_2_maximum_delta);
        }
        ImRect::Translate((ImRect *)&mouse_delta_2d,(ImVec2 *)&stack0xffffffffffffff5c);
        MarkItemEdited(id);
      }
    }
    if ((bb_interact.Max.x._1_1_ & 1) == 0) {
      bVar2 = false;
      if ((bb_interact.Max.x._2_1_ & 1) != 0) {
        bVar2 = hover_visibility_delay <= pIVar3->HoveredIdTimer;
      }
      local_b0 = 0x1b;
      if (bVar2) {
        local_b0 = 0x1c;
      }
    }
    else {
      local_b0 = 0x1d;
    }
    col_00 = GetColorU32(local_b0,1.0);
    ImDrawList::AddRectFilled(pIVar1->DrawList,&mouse_delta_2d,&bb_render.Min,col_00,0.0,0xf);
    bb_local._7_1_ = (bool)(bb_interact.Max.x._1_1_ & 1);
  }
  else {
    bb_local._7_1_ = false;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, 0.0f);

    return held;
}